

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O0

bool double_conversion::ComputeGuess(Vector<const_char> trimmed,int exponent,double *guess)

{
  long lVar1;
  Vector<const_char> trimmed_00;
  bool bVar2;
  int iVar3;
  double *in_RCX;
  int in_EDX;
  undefined4 in_ESI;
  char *in_RDI;
  long in_FS_OFFSET;
  double dVar4;
  double dVar5;
  double *unaff_retaddr;
  int in_stack_00000008;
  undefined1 in_stack_00000090 [16];
  double *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  bool local_39;
  undefined4 uStack_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = Vector<const_char>::length((Vector<const_char> *)&stack0xffffffffffffffe8);
  if (iVar3 == 0) {
    *in_RCX = 0.0;
    local_39 = true;
  }
  else {
    iVar3 = Vector<const_char>::length((Vector<const_char> *)&stack0xffffffffffffffe8);
    if (in_EDX + iVar3 + -1 < 0x135) {
      iVar3 = Vector<const_char>::length((Vector<const_char> *)&stack0xffffffffffffffe8);
      if (in_EDX + iVar3 < -0x143) {
        *in_RCX = 0.0;
        local_39 = true;
      }
      else {
        trimmed_00.start_._4_4_ = uStack_c;
        trimmed_00.start_._0_4_ = in_ESI;
        trimmed_00._8_8_ = in_RDI;
        bVar2 = DoubleStrtod(trimmed_00,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
        if (!bVar2) {
          bVar2 = DiyFpStrtod((Vector<const_char>)in_stack_00000090,in_stack_00000008,unaff_retaddr)
          ;
          if (!bVar2) {
            dVar4 = *in_RCX;
            dVar5 = Double::Infinity();
            if ((dVar4 != dVar5) || (NAN(dVar4) || NAN(dVar5))) {
              local_39 = false;
            }
            else {
              local_39 = true;
            }
            goto LAB_0070b934;
          }
        }
        local_39 = true;
      }
    }
    else {
      dVar4 = Double::Infinity();
      *in_RCX = dVar4;
      local_39 = true;
    }
  }
LAB_0070b934:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

static bool ComputeGuess(Vector<const char> trimmed, int exponent,
                         double* guess) {
  if (trimmed.length() == 0) {
    *guess = 0.0;
    return true;
  }
  if (exponent + trimmed.length() - 1 >= kMaxDecimalPower) {
    *guess = Double::Infinity();
    return true;
  }
  if (exponent + trimmed.length() <= kMinDecimalPower) {
    *guess = 0.0;
    return true;
  }

  if (DoubleStrtod(trimmed, exponent, guess) ||
      DiyFpStrtod(trimmed, exponent, guess)) {
    return true;
  }
  if (*guess == Double::Infinity()) {
    return true;
  }
  return false;
}